

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderReadTree(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if (reader->state == XML_TEXTREADER_END) {
    reader_local._4_4_ = 0;
  }
  else {
    do {
      if (reader->node == (xmlNodePtr)0x0) {
        if (reader->doc->children == (_xmlNode *)0x0) {
          reader->state = XML_TEXTREADER_END;
          return 0;
        }
        reader->node = reader->doc->children;
        reader->state = XML_TEXTREADER_START;
      }
      else if ((((reader->state == XML_TEXTREADER_BACKTRACK) || (reader->node->type == XML_DTD_NODE)
                ) || (reader->node->type == XML_XINCLUDE_START)) ||
              (reader->node->type == XML_ENTITY_REF_NODE)) {
LAB_001efda7:
        if (reader->node->next == (_xmlNode *)0x0) {
          if (reader->node->parent == (_xmlNode *)0x0) {
            reader->state = XML_TEXTREADER_END;
          }
          else {
            if ((reader->node->parent->type == XML_DOCUMENT_NODE) ||
               (reader->node->parent->type == XML_HTML_DOCUMENT_NODE)) {
              reader->state = XML_TEXTREADER_END;
              return 0;
            }
            reader->node = reader->node->parent;
            reader->depth = reader->depth + -1;
            reader->state = XML_TEXTREADER_BACKTRACK;
          }
        }
        else {
          reader->node = reader->node->next;
          reader->state = XML_TEXTREADER_START;
        }
      }
      else if (reader->node->children == (_xmlNode *)0x0) {
        if (reader->node->type != XML_ATTRIBUTE_NODE) goto LAB_001efda7;
        reader->state = XML_TEXTREADER_BACKTRACK;
      }
      else {
        reader->node = reader->node->children;
        reader->depth = reader->depth + 1;
        reader->state = XML_TEXTREADER_START;
      }
    } while ((reader->node->type == XML_XINCLUDE_START) || (reader->node->type == XML_XINCLUDE_END))
    ;
    reader_local._4_4_ = 1;
  }
  return reader_local._4_4_;
}

Assistant:

static int
xmlTextReaderReadTree(xmlTextReaderPtr reader) {
    if (reader->state == XML_TEXTREADER_END)
        return(0);

next_node:
    if (reader->node == NULL) {
        if (reader->doc->children == NULL) {
            reader->state = XML_TEXTREADER_END;
            return(0);
        }

        reader->node = reader->doc->children;
        reader->state = XML_TEXTREADER_START;
        goto found_node;
    }

    if ((reader->state != XML_TEXTREADER_BACKTRACK) &&
        (reader->node->type != XML_DTD_NODE) &&
        (reader->node->type != XML_XINCLUDE_START) &&
	(reader->node->type != XML_ENTITY_REF_NODE)) {
        if (reader->node->children != NULL) {
            reader->node = reader->node->children;
            reader->depth++;
            reader->state = XML_TEXTREADER_START;
            goto found_node;
        }

        if (reader->node->type == XML_ATTRIBUTE_NODE) {
            reader->state = XML_TEXTREADER_BACKTRACK;
            goto found_node;
        }
    }

    if (reader->node->next != NULL) {
        reader->node = reader->node->next;
        reader->state = XML_TEXTREADER_START;
        goto found_node;
    }

    if (reader->node->parent != NULL) {
        if ((reader->node->parent->type == XML_DOCUMENT_NODE) ||
	    (reader->node->parent->type == XML_HTML_DOCUMENT_NODE)) {
            reader->state = XML_TEXTREADER_END;
            return(0);
        }

        reader->node = reader->node->parent;
        reader->depth--;
        reader->state = XML_TEXTREADER_BACKTRACK;
        goto found_node;
    }

    reader->state = XML_TEXTREADER_END;

found_node:
    if ((reader->node->type == XML_XINCLUDE_START) ||
        (reader->node->type == XML_XINCLUDE_END))
	goto next_node;

    return(1);
}